

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorTiledVertical.cpp
# Opt level: O2

void __thiscall
Rml::DecoratorTiledVertical::RenderElement
          (DecoratorTiledVertical *this,Element *element,DecoratorDataHandle element_data)

{
  long lVar1;
  Vector2<float> VVar2;
  long lVar3;
  long lVar4;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  Texture texture;
  UniqueRenderResource<Rml::CompiledShader,_unsigned_long,_0UL> local_58;
  undefined1 local_48 [16];
  
  local_58.render_manager = (RenderManager *)Element::GetAbsoluteOffset(element,Padding);
  VVar2 = Vector2<float>::Round((Vector2<float> *)&local_58);
  local_48._8_4_ = extraout_XMM0_Dc;
  local_48._0_4_ = VVar2.x;
  local_48._4_4_ = VVar2.y;
  local_48._12_4_ = extraout_XMM0_Dd;
  lVar3 = 0;
  for (lVar4 = 0; lVar4 < *(int *)element_data; lVar4 = lVar4 + 1) {
    lVar1 = *(long *)(element_data + 8);
    texture = Decorator::GetTexture((Decorator *)this,(int)lVar4);
    local_58.render_manager = (RenderManager *)0x0;
    local_58.resource_handle = 0;
    Geometry::Render((Geometry *)(lVar1 + lVar3),(Vector2f)local_48._0_8_,texture,
                     (CompiledShader *)&local_58);
    UniqueRenderResource<Rml::CompiledShader,_unsigned_long,_0UL>::~UniqueRenderResource(&local_58);
    lVar3 = lVar3 + 0x10;
  }
  return;
}

Assistant:

void DecoratorTiledVertical::RenderElement(Element* element, DecoratorDataHandle element_data) const
{
	Vector2f translation = element->GetAbsoluteOffset(BoxArea::Padding).Round();
	DecoratorTiledVerticalData* data = reinterpret_cast<DecoratorTiledVerticalData*>(element_data);

	for (int i = 0; i < data->num_textures; i++)
		data->geometry[i].Render(translation, GetTexture(i));
}